

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float32 float32_gen2(float32 xa,float32 xb,float_status *s,hard_f32_op2_fn hard,soft_f32_op2_fn soft
                    ,f32_check_fn pre,f32_check_fn post,f32_check_fn fast_test,
                    soft_f32_op2_fn fast_op)

{
  _Bool _Var1;
  float32 fVar2;
  undefined7 extraout_var;
  float_status *extraout_RDX;
  float_status *extraout_RDX_00;
  float_status *pfVar3;
  union_float32 uVar4;
  union_float32 uVar5;
  union_float32 a;
  union_float32 local_40;
  union_float32 ur;
  union_float32 ub;
  union_float32 ua;
  f32_check_fn pre_local;
  soft_f32_op2_fn soft_local;
  hard_f32_op2_fn hard_local;
  float_status *s_local;
  float32 local_10;
  float32 xb_local;
  float32 xa_local;
  
  local_40.s = xb;
  ur.s = xa;
  _ub = pre;
  pre_local = (f32_check_fn)soft;
  soft_local = (soft_f32_op2_fn)hard;
  hard_local = (hard_f32_op2_fn)s;
  s_local._4_4_ = xb;
  local_10 = xa;
  _Var1 = can_use_fpu(s);
  if (((_Var1 ^ 0xffU) & 1) == 0) {
    float32_input_flush2(&ur.s,&local_40.s,(float_status *)hard_local);
    uVar4 = local_40;
    uVar5 = ur;
    _Var1 = (*_ub)(ur,local_40);
    if (((_Var1 ^ 0xffU) & 1) == 0) {
      pfVar3 = extraout_RDX;
      if ((fast_test != (f32_check_fn)0x0) &&
         (uVar4 = local_40, uVar5 = ur, _Var1 = (*fast_test)(ur,local_40), pfVar3 = extraout_RDX_00,
         _Var1)) {
        fVar2 = (*fast_op)(ur.s,local_40.s,(float_status *)hard_local);
        return fVar2;
      }
      (*soft_local)(uVar5.s,uVar4.s,pfVar3);
      _Var1 = f32_is_inf(a);
      if (_Var1) {
        hard_local[2] = (_func_float_float_float)((byte)hard_local[2] | 8);
        return a.s;
      }
      if (1.1754944e-38 < ABS(a.h)) {
        return a.s;
      }
      if ((post != (f32_check_fn)0x0) && (_Var1 = (*post)(ur,local_40), !_Var1)) {
        return a.s;
      }
    }
  }
  _Var1 = (*pre_local)(ur,local_40);
  return (float32)CONCAT71(extraout_var,_Var1);
}

Assistant:

static inline float32
float32_gen2(float32 xa, float32 xb, float_status *s,
             hard_f32_op2_fn hard, soft_f32_op2_fn soft,
             f32_check_fn pre, f32_check_fn post,
             f32_check_fn fast_test, soft_f32_op2_fn fast_op)
{
    union_float32 ua, ub, ur;

    ua.s = xa;
    ub.s = xb;

    if (unlikely(!can_use_fpu(s))) {
        goto soft;
    }

    float32_input_flush2(&ua.s, &ub.s, s);
    if (unlikely(!pre(ua, ub))) {
        goto soft;
    }
    if (fast_test && fast_test(ua, ub)) {
        return fast_op(ua.s, ub.s, s);
    }

    ur.h = hard(ua.h, ub.h);
    if (unlikely(f32_is_inf(ur))) {
        s->float_exception_flags |= float_flag_overflow;
    } else if (unlikely(fabsf(ur.h) <= FLT_MIN)) {
        if (post == NULL || post(ua, ub)) {
            goto soft;
        }
    }
    return ur.s;

 soft:
    return soft(ua.s, ub.s, s);
}